

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isGatherOffsetsResultValid<tcu::IntLookupPrecision,int>
               (ConstPixelBufferAccess *level,Sampler *sampler,IntLookupPrecision *prec,Vec2 *coord,
               int coordZ,int componentNdx,IVec2 (*offsets) [4],Vector<int,_4> *result)

{
  WrapMode WVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  deInt32 dVar6;
  deInt32 dVar7;
  deInt32 dVar8;
  deInt32 dVar9;
  int iVar10;
  int *piVar11;
  float fVar12;
  Vector<int,_4> local_94;
  int local_84;
  int local_80;
  int y;
  int x;
  int offNdx;
  Vector<int,_4> color;
  int i;
  int j;
  int h;
  int w;
  int maxJ;
  int minJ;
  int maxI;
  int minI;
  Vec2 vBounds;
  Vec2 uBounds;
  int componentNdx_local;
  int coordZ_local;
  Vec2 *coord_local;
  IntLookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getWidth(level);
  fVar12 = Vector<float,_2>::x(coord);
  iVar4 = Vector<int,_3>::x((Vector<int,_3> *)prec);
  iVar5 = Vector<int,_3>::x((Vector<int,_3> *)(prec + 0xc));
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,(bool)(bVar2 & 1),iVar3,fVar12,iVar4,iVar5);
  bVar2 = sampler->normalizedCoords;
  iVar3 = ConstPixelBufferAccess::getHeight(level);
  fVar12 = Vector<float,_2>::y(coord);
  iVar4 = Vector<int,_3>::y((Vector<int,_3> *)prec);
  iVar5 = Vector<int,_3>::y((Vector<int,_3> *)(prec + 0xc));
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI,(bool)(bVar2 & 1),iVar3,fVar12,iVar4,iVar5);
  fVar12 = Vector<float,_2>::x(&vBounds);
  dVar6 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::y(&vBounds);
  dVar7 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::x((Vector<float,_2> *)&maxI);
  dVar8 = deFloorFloatToInt32(fVar12 - 0.5);
  fVar12 = Vector<float,_2>::y((Vector<float,_2> *)&maxI);
  dVar9 = deFloorFloatToInt32(fVar12 - 0.5);
  iVar3 = ConstPixelBufferAccess::getWidth(level);
  iVar4 = ConstPixelBufferAccess::getHeight(level);
  color.m_data[3] = dVar8;
  do {
    color.m_data[2] = dVar6;
    if (dVar9 < color.m_data[3]) {
      return false;
    }
    for (; color.m_data[2] <= dVar7; color.m_data[2] = color.m_data[2] + 1) {
      Vector<int,_4>::Vector((Vector<int,_4> *)&x);
      for (y = 0; iVar5 = color.m_data[2], y < 4; y = y + 1) {
        WVar1 = sampler->wrapS;
        iVar10 = Vector<int,_2>::x(*offsets + y);
        local_80 = TexVerifierUtil::wrap(WVar1,iVar5 + iVar10,iVar3);
        iVar5 = color.m_data[3];
        WVar1 = sampler->wrapT;
        iVar10 = Vector<int,_2>::y(*offsets + y);
        local_84 = TexVerifierUtil::wrap(WVar1,iVar5 + iVar10,iVar4);
        lookup<int>((tcu *)&local_94,level,sampler,local_80,local_84,coordZ);
        piVar11 = Vector<int,_4>::operator[](&local_94,componentNdx);
        iVar5 = *piVar11;
        piVar11 = Vector<int,_4>::operator[]((Vector<int,_4> *)&x,y);
        *piVar11 = iVar5;
      }
      bVar2 = isColorValid(prec,(IVec4 *)&x,result);
      if (bVar2) {
        return true;
      }
    }
    color.m_data[3] = color.m_data[3] + 1;
  } while( true );
}

Assistant:

static bool isGatherOffsetsResultValid (const ConstPixelBufferAccess&	level,
										const Sampler&					sampler,
										const PrecType&					prec,
										const Vec2&						coord,
										int								coordZ,
										int								componentNdx,
										const IVec2						(&offsets)[4],
										const Vector<ScalarType, 4>&	result)
{
	const Vec2	uBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(), coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI		= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI		= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ		= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ		= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w			= level.getWidth();
	const int	h			= level.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			Vector<ScalarType, 4> color;
			for (int offNdx = 0; offNdx < 4; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int x = wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int y = wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				color[offNdx] = lookup<ScalarType>(level, sampler, x, y, coordZ)[componentNdx];
			}

			if (isColorValid(prec, color, result))
				return true;
		}
	}

	return false;
}